

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ba_linear_solver.cc
# Opt level: O0

void sfm::ba::anon_unknown_4::matrix_block_column_multiply
               (SparseMatrix<double> *A,size_t block_size,SparseMatrix<double> *B)

{
  pointer pDVar1;
  pointer this;
  size_t sVar2;
  pointer pDVar3;
  reference pvVar4;
  reference pvVar5;
  size_t cols;
  unsigned_long local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  unsigned_long local_a8;
  double local_a0;
  size_t row;
  unsigned_long local_90;
  double local_88;
  double dot;
  size_t col_1;
  size_t col;
  undefined1 local_68 [8];
  vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_> columns;
  size_t block;
  undefined1 local_38 [8];
  Triplets triplets;
  SparseMatrix<double> *B_local;
  size_t block_size_local;
  SparseMatrix<double> *A_local;
  
  triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)B;
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::vector((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
            *)local_38);
  sVar2 = SparseMatrix<double>::num_cols(A);
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::reserve((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
             *)local_38,sVar2 * block_size);
  columns.
  super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pDVar1 = columns.
             super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pDVar3 = (pointer)SparseMatrix<double>::num_cols(A);
    this = triplets.
           super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pDVar3 <= pDVar1) break;
    std::allocator<sfm::ba::DenseVector<double>_>::allocator
              ((allocator<sfm::ba::DenseVector<double>_> *)((long)&col + 7));
    std::vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>::
    vector((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_> *)
           local_68,block_size,(allocator<sfm::ba::DenseVector<double>_> *)((long)&col + 7));
    std::allocator<sfm::ba::DenseVector<double>_>::~allocator
              ((allocator<sfm::ba::DenseVector<double>_> *)((long)&col + 7));
    for (col_1 = 0; col_1 < block_size; col_1 = col_1 + 1) {
      sVar2 = (long)&((columns.
                       super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + col_1;
      pvVar4 = std::
               vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
               ::operator[]((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                             *)local_68,col_1);
      SparseMatrix<double>::column_nonzeros(A,sVar2,pvVar4);
    }
    for (dot = 0.0; (ulong)dot < block_size; dot = (double)((long)dot + 1)) {
      pvVar4 = std::
               vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
               ::operator[]((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                             *)local_68,(size_type)dot);
      pvVar5 = std::
               vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
               ::operator[]((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                             *)local_68,(size_type)dot);
      local_88 = DenseVector<double>::dot(pvVar4,pvVar5);
      local_90 = (long)&((columns.
                          super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)dot;
      row = (long)&((columns.
                     super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)dot;
      std::
      vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
      ::emplace_back<unsigned_long,unsigned_long,double&>
                ((vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
                  *)local_38,&local_90,&row,&local_88);
      local_a0 = dot;
      while (local_a0 = (double)((long)local_a0 + 1), (ulong)local_a0 < block_size) {
        pvVar4 = std::
                 vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                 ::operator[]((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                               *)local_68,(size_type)dot);
        pvVar5 = std::
                 vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                 ::operator[]((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                               *)local_68,(size_type)local_a0);
        local_88 = DenseVector<double>::dot(pvVar4,pvVar5);
        local_a8 = (long)&((columns.
                            super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)local_a0;
        local_b0 = (long)&((columns.
                            super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)dot;
        std::
        vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
        ::emplace_back<unsigned_long,unsigned_long,double&>
                  ((vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
                    *)local_38,&local_a8,&local_b0,&local_88);
        local_b8 = (long)&((columns.
                            super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)dot;
        local_c0 = (long)&((columns.
                            super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)local_a0;
        std::
        vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
        ::emplace_back<unsigned_long,unsigned_long,double&>
                  ((vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
                    *)local_38,&local_b8,&local_c0,&local_88);
      }
    }
    std::vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>::
    ~vector((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_> *)
            local_68);
    columns.
    super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((columns.
                            super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->values).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + block_size);
  }
  sVar2 = SparseMatrix<double>::num_cols(A);
  cols = SparseMatrix<double>::num_cols(A);
  SparseMatrix<double>::allocate((SparseMatrix<double> *)this,sVar2,cols);
  SparseMatrix<double>::set_from_triplets
            ((SparseMatrix<double> *)
             triplets.
             super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(Triplets *)local_38);
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::~vector((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
             *)local_38);
  return;
}

Assistant:

void
    matrix_block_column_multiply (SparseMatrix<double> const& A,
        std::size_t block_size, SparseMatrix<double>* B)
    {
        SparseMatrix<double>::Triplets triplets;
        triplets.reserve(A.num_cols() * block_size);
        for (std::size_t block = 0; block < A.num_cols(); block += block_size)
        {
            std::vector<DenseVector<double>> columns(block_size);
            for (std::size_t col = 0; col < block_size; ++col)
                A.column_nonzeros(block + col, &columns[col]);
            for (std::size_t col = 0; col < block_size; ++col)
            {
                double dot = columns[col].dot(columns[col]);
                triplets.emplace_back(block + col, block + col, dot);
                for (std::size_t row = col + 1; row < block_size; ++row)
                {
                    dot = columns[col].dot(columns[row]);
                    triplets.emplace_back(block + row, block + col, dot);
                    triplets.emplace_back(block + col, block + row, dot);
                }
            }
        }
        B->allocate(A.num_cols(), A.num_cols());
        B->set_from_triplets(triplets);
    }